

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml.c
# Opt level: O2

PyObject * libxml_xmlFreeParserCtxt(PyObject *self,PyObject *args)

{
  long lVar1;
  undefined8 *puVar2;
  int iVar3;
  undefined *in_RAX;
  PyObject *pPVar4;
  PyObject *pyobj_ctxt;
  undefined *local_18;
  
  pPVar4 = (PyObject *)0x0;
  local_18 = in_RAX;
  iVar3 = _PyArg_ParseTuple_SizeT(args,"O:xmlFreeParserCtxt",&local_18);
  if (iVar3 != 0) {
    if ((local_18 != &_Py_NoneStruct) && (lVar1 = *(long *)(local_18 + 0x10), lVar1 != 0)) {
      puVar2 = *(undefined8 **)(lVar1 + 0x1a8);
      if (puVar2 != (undefined8 *)0x0) {
        _Py_XDECREF((PyObject *)*puVar2);
        _Py_XDECREF((PyObject *)puVar2[1]);
        (*_xmlFree)(puVar2);
      }
      xmlFreeParserCtxt(lVar1);
    }
    pPVar4 = (PyObject *)&_Py_NoneStruct;
    __Py_NoneStruct = __Py_NoneStruct + 1;
  }
  return pPVar4;
}

Assistant:

static PyObject *
libxml_xmlFreeParserCtxt(ATTRIBUTE_UNUSED PyObject *self, PyObject *args) {
    xmlParserCtxtPtr ctxt;
    PyObject *pyobj_ctxt;
    xmlParserCtxtPyCtxtPtr pyCtxt;

    if (!PyArg_ParseTuple(args, (char *)"O:xmlFreeParserCtxt", &pyobj_ctxt))
        return(NULL);
    ctxt = (xmlParserCtxtPtr) PyparserCtxt_Get(pyobj_ctxt);

    if (ctxt != NULL) {
	pyCtxt = (xmlParserCtxtPyCtxtPtr)((xmlParserCtxtPtr)ctxt)->_private;
	if (pyCtxt) {
	    Py_XDECREF(pyCtxt->f);
	    Py_XDECREF(pyCtxt->arg);
	    xmlFree(pyCtxt);
	}
	xmlFreeParserCtxt(ctxt);
    }

    Py_INCREF(Py_None);
    return(Py_None);
}